

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

string * __thiscall
wabt::Decompiler::LocalDecl(string *__return_storage_ptr__,Decompiler *this,string *name,Type t)

{
  ulong uVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar3;
  allocator local_8d;
  Enum local_8c;
  string local_88 [32];
  string_view local_68;
  string_view local_58;
  undefined1 local_48 [8];
  string struc;
  string *name_local;
  Decompiler *this_local;
  Type t_local;
  
  struc.field_2._8_8_ = name;
  LoadStoreTracking::GenTypeDecl((string *)local_48,&this->lst,name);
  string_view::string_view(&local_68,(string *)struc.field_2._8_8_);
  local_58 = VarName(this,local_68);
  uVar1 = std::__cxx11::string::empty();
  bVar3 = (uVar1 & 1) != 0;
  if (bVar3) {
    local_8c = t.enum_;
    pcVar2 = GetDecompTypeName(t);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,pcVar2,&local_8d);
  }
  else {
    std::__cxx11::string::string(local_88,(string *)local_48);
  }
  cat<wabt::string_view,char[2],std::__cxx11::string>
            (__return_storage_ptr__,(wabt *)&local_58,(string_view *)":",(char (*) [2])local_88,
             in_R8);
  std::__cxx11::string::~string(local_88);
  if (bVar3) {
    std::allocator<char>::~allocator((allocator<char> *)&local_8d);
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string LocalDecl(const std::string& name, Type t) {
    auto struc = lst.GenTypeDecl(name);
    return cat(VarName(name), ":",
               struc.empty() ? GetDecompTypeName(t) : struc);
  }